

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glTF2Importer.cpp
# Opt level: O0

void __thiscall Assimp::glTF2Importer::ImportCommonMetadata(glTF2Importer *this,Asset *a)

{
  byte bVar1;
  aiMetadata *paVar2;
  aiString local_ca8;
  allocator<char> local_8a1;
  string local_8a0;
  aiString local_880;
  allocator<char> local_479;
  string local_478;
  aiString local_458;
  allocator<char> local_41;
  string local_40;
  byte local_1b;
  byte local_1a;
  byte local_19;
  bool hasCopyright;
  bool hasGenerator;
  Asset *pAStack_18;
  bool hasVersion;
  Asset *a_local;
  glTF2Importer *this_local;
  
  pAStack_18 = a;
  a_local = (Asset *)this;
  if (this->mScene->mMetaData != (aiMetadata *)0x0) {
    __assert_fail("mScene->mMetaData == nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/glTF2/glTF2Importer.cpp"
                  ,0x4f8,"void Assimp::glTF2Importer::ImportCommonMetadata(glTF2::Asset &)");
  }
  bVar1 = std::__cxx11::string::empty();
  local_19 = (bVar1 ^ 0xff) & 1;
  bVar1 = std::__cxx11::string::empty();
  local_1a = (bVar1 ^ 0xff) & 1;
  bVar1 = std::__cxx11::string::empty();
  local_1b = (bVar1 ^ 0xff) & 1;
  if ((((local_19 & 1) != 0) || ((local_1a & 1) != 0)) || (local_1b != 0)) {
    paVar2 = (aiMetadata *)operator_new(0x18);
    aiMetadata::aiMetadata(paVar2);
    this->mScene->mMetaData = paVar2;
    if ((local_19 & 1) != 0) {
      paVar2 = this->mScene->mMetaData;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_40,"SourceAsset_FormatVersion",&local_41);
      aiString::aiString(&local_458,&(pAStack_18->asset).version);
      aiMetadata::Add<aiString>(paVar2,&local_40,&local_458);
      std::__cxx11::string::~string((string *)&local_40);
      std::allocator<char>::~allocator(&local_41);
    }
    if ((local_1a & 1) != 0) {
      paVar2 = this->mScene->mMetaData;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_478,"SourceAsset_Generator",&local_479);
      aiString::aiString(&local_880,&(pAStack_18->asset).generator);
      aiMetadata::Add<aiString>(paVar2,&local_478,&local_880);
      std::__cxx11::string::~string((string *)&local_478);
      std::allocator<char>::~allocator(&local_479);
    }
    if ((local_1b & 1) != 0) {
      paVar2 = this->mScene->mMetaData;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_8a0,"SourceAsset_Copyright",&local_8a1);
      aiString::aiString(&local_ca8,&(pAStack_18->asset).copyright);
      aiMetadata::Add<aiString>(paVar2,&local_8a0,&local_ca8);
      std::__cxx11::string::~string((string *)&local_8a0);
      std::allocator<char>::~allocator(&local_8a1);
    }
  }
  return;
}

Assistant:

void glTF2Importer::ImportCommonMetadata(glTF2::Asset& a) {
    ai_assert(mScene->mMetaData == nullptr);
    const bool hasVersion = !a.asset.version.empty();
    const bool hasGenerator = !a.asset.generator.empty();
    const bool hasCopyright = !a.asset.copyright.empty();
    if (hasVersion || hasGenerator || hasCopyright) {
        mScene->mMetaData = new aiMetadata;
        if (hasVersion) {
            mScene->mMetaData->Add(AI_METADATA_SOURCE_FORMAT_VERSION, aiString(a.asset.version));
        }
        if (hasGenerator) {
            mScene->mMetaData->Add(AI_METADATA_SOURCE_GENERATOR, aiString(a.asset.generator));
        }
        if (hasCopyright) {
            mScene->mMetaData->Add(AI_METADATA_SOURCE_COPYRIGHT, aiString(a.asset.copyright));
        }
    }
}